

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::bin_writer<1>>
::operator()(padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::bin_writer<1>>
             *this,char **it)

{
  int iVar1;
  size_t __n;
  char *__dest;
  size_t __n_00;
  ulong uVar2;
  ulong uVar3;
  byte *pbVar4;
  char *__s;
  char *pcVar5;
  ulong uVar6;
  size_t __len;
  ptrdiff_t _Num;
  bool bVar7;
  bool bVar8;
  
  __n = *(size_t *)(this + 0x10);
  __dest = *it;
  __s = __dest;
  if (__n != 0) {
    memmove(__dest,*(void **)(this + 8),__n);
    __s = __dest + __n;
    *it = __s;
  }
  __n_00 = *(size_t *)(this + 0x20);
  pcVar5 = __s;
  if (__n_00 != 0) {
    pcVar5 = __s + __n_00;
    memset(__s,*(int *)(this + 0x18),__n_00);
  }
  iVar1 = *(int *)(this + 0x40);
  pbVar4 = (byte *)(__dest + __n_00 + __n + (long)iVar1);
  uVar3 = *(ulong *)(this + 0x30);
  uVar6 = *(ulong *)(this + 0x38);
  do {
    pbVar4 = pbVar4 + -1;
    *pbVar4 = (byte)uVar3 & 1 | 0x30;
    bVar7 = 1 < uVar3;
    bVar8 = uVar6 != 0;
    uVar2 = -uVar6;
    uVar3 = uVar6 << 0x3f | uVar3 >> 1;
    uVar6 = uVar6 >> 1;
  } while (bVar8 || uVar2 < bVar7);
  *it = pcVar5 + iVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
      if (prefix.size() != 0)
        it = copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }